

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * Catch::fpToString<double>(string *__return_storage_ptr__,double value,int precision)

{
  long lVar1;
  long local_1c0;
  ostringstream oss;
  uint auStack_1a8 [22];
  ios_base local_150 [264];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  double local_28;
  
  local_28 = value;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1c0);
  *(long *)(&oss + *(long *)(local_1c0 + -0x18)) = (long)precision;
  *(uint *)((long)auStack_1a8 + *(long *)(local_1c0 + -0x18)) =
       *(uint *)((long)auStack_1a8 + *(long *)(local_1c0 + -0x18)) & 0xfffffefb | 4;
  std::ostream::_M_insert<double>(local_28);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)__return_storage_ptr__,0x30);
  if ((lVar1 != -1) && (lVar1 != __return_storage_ptr__->_M_string_length - 1)) {
    std::__cxx11::string::substr((ulong)local_48,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_48);
    if (local_48[0] != local_38) {
      operator_delete(local_48[0]);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1c0);
  std::ios_base::~ios_base(local_150);
  return __return_storage_ptr__;
}

Assistant:

std::string fpToString(T value, int precision) {
		std::ostringstream oss;
		oss << std::setprecision(precision)
			<< std::fixed
			<< value;
		std::string d = oss.str();
		std::size_t i = d.find_last_not_of('0');
		if (i != std::string::npos && i != d.size() - 1) {
			if (d[i] == '.')
				i++;
			d = d.substr(0, i + 1);
		}
		return d;
	}